

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# version.cpp
# Opt level: O1

string * libcellml::versionString_abi_cxx11_(void)

{
  string *in_RDI;
  
  (in_RDI->_M_dataplus)._M_p = (pointer)&in_RDI->field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)in_RDI,LIBCELLML_LIBRARY_VERSION_STRING_abi_cxx11_,
             DAT_002fb910 + LIBCELLML_LIBRARY_VERSION_STRING_abi_cxx11_);
  return in_RDI;
}

Assistant:

std::string versionString()
{
    return LIBCELLML_LIBRARY_VERSION_STRING;
}